

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O0

char * rapidjson::internal::dtoa(double value,char *buffer)

{
  bool bVar1;
  int local_30;
  int local_2c;
  int K;
  int length;
  Double d;
  char *buffer_local;
  double value_local;
  
  d.field_0 = (anon_union_8_2_f9eca910_for_Double_7)buffer;
  Double::Double((Double *)&K,value);
  bVar1 = Double::IsZero((Double *)&K);
  if (bVar1) {
    bVar1 = Double::Sign((Double *)&K);
    if (bVar1) {
      *(undefined1 *)d.field_0 = 0x2d;
      d.field_0 = (anon_union_8_2_f9eca910_for_Double_7)
                  (anon_union_8_2_f9eca910_for_Double_7)(d.field_0 + 1).u_;
    }
    *(undefined1 *)d.field_0 = 0x30;
    *(undefined1 *)((long)d.field_0 + 1) = 0x2e;
    *(undefined1 *)((long)d.field_0 + 2) = 0x30;
    value_local = (double)((long)d.field_0 + 3);
  }
  else {
    buffer_local = (char *)value;
    if (value < 0.0) {
      *(undefined1 *)d.field_0 = 0x2d;
      buffer_local = (char *)((ulong)value ^ 0x8000000000000000);
      d.field_0 = (anon_union_8_2_f9eca910_for_Double_7)
                  (anon_union_8_2_f9eca910_for_Double_7)(d.field_0 + 1).u_;
    }
    Grisu2((double)buffer_local,(char *)d.field_0,&local_2c,&local_30);
    value_local = (double)Prettify((char *)d.field_0,local_2c,local_30);
  }
  return (char *)value_local;
}

Assistant:

inline char* dtoa(double value, char* buffer) {
    Double d(value);
    if (d.IsZero()) {
        if (d.Sign())
            *buffer++ = '-';     // -0.0, Issue #289
        buffer[0] = '0';
        buffer[1] = '.';
        buffer[2] = '0';
        return &buffer[3];
    }
    else {
        if (value < 0) {
            *buffer++ = '-';
            value = -value;
        }
        int length, K;
        Grisu2(value, buffer, &length, &K);
        return Prettify(buffer, length, K);
    }
}